

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintserialize.h
# Opt level: O3

ssize_t bsplib::UIntSerialize<int>::write(int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  
  if (-1 < __fd) {
    lVar2 = 0;
    uVar3 = (ulong)(uint)__fd;
    do {
      uVar3 = uVar3 >> 7;
      *(byte *)((long)__buf + lVar2) = (0x7fU < (uint)__fd) << 7 | (byte)__fd & 0x7f;
      lVar2 = lVar2 + 1;
      bVar1 = 0x7f < (uint)__fd;
      __fd = (uint)uVar3;
    } while (bVar1);
    return lVar2;
  }
  __assert_fail("x >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/uintserialize.h"
                ,0x14,"static int bsplib::UIntSerialize<int>::write(UInt, Buffer &) [UInt = int]");
}

Assistant:

static int write( UInt x, Buffer & bytes ) {
        assert( x >= 0 );
        int i = 0;
        do {
            unsigned char m = (1 << (CHAR_BIT-1));
            unsigned char c = x & (m-1); // cut out least significant bits
            x >>= (CHAR_BIT-1);          // and save these in c
            c |= (x > 0) * m ;  // set highest signif. bit if continuing
            bytes[i++] = c;
        } while ( x != 0 );
        return i;
    }